

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O3

int sendMessage(string *cmd,int new_fd,string *currUser,
               vector<cUser,_std::allocator<cUser>_> *currUsers,bool *msgFlags,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *msgs)

{
  anon_struct_40_2_6a8bb0e8 *paVar1;
  pointer paVar2;
  pointer pcVar3;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  ssize_t sVar7;
  size_type *psVar8;
  ulong *puVar9;
  size_type *psVar10;
  size_type *psVar11;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> __it;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> __it_00;
  long lVar12;
  long lVar13;
  pointer paVar14;
  bool bVar15;
  size_type *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  long local_128;
  undefined1 local_120 [16];
  vector<cUser,_std::allocator<cUser>_> *local_110;
  undefined1 *local_108;
  string username;
  char *local_d8;
  string msg;
  size_type *local_a8;
  size_type *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type *local_78;
  pointer local_70;
  ulong local_68;
  size_type sStack_60;
  size_type *local_58;
  cUser user;
  
  username.field_2._8_8_ = msgs;
  __str.field_2._8_8_ = currUser;
  std::__cxx11::string::find((char *)cmd,0x1091e5,0);
  std::__cxx11::string::substr((ulong)&local_108,(ulong)cmd);
  std::__cxx11::string::substr((ulong)&local_d8,(ulong)cmd);
  local_58 = &user.username._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"all","");
  psVar11 = local_58;
  if (username._M_dataplus._M_p == user.username._M_dataplus._M_p) {
    if (username._M_dataplus._M_p == (pointer)0x0) {
      bVar15 = true;
    }
    else {
      iVar4 = bcmp(local_108,local_58,(size_t)username._M_dataplus._M_p);
      bVar15 = iVar4 == 0;
    }
  }
  else {
    bVar15 = false;
  }
  if (psVar11 != &user.username._M_string_length) {
    operator_delete(psVar11);
  }
  if (bVar15) {
    local_a0 = &__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,*(long *)__str.field_2._8_8_,
               *(long *)(__str.field_2._8_8_ + 8) + *(long *)__str.field_2._8_8_);
    std::__cxx11::string::append((char *)&local_a0);
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_d8);
    psVar11 = &user.username._M_string_length;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar8) {
      user.username._M_string_length = *psVar8;
      user.username.field_2._M_allocated_capacity = plVar5[3];
      local_58 = psVar11;
    }
    else {
      user.username._M_string_length = *psVar8;
      local_58 = (size_type *)*plVar5;
    }
    user.username._M_dataplus._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_58);
    if (local_58 != psVar11) {
      operator_delete(local_58);
    }
    if (local_a0 != &__str._M_string_length) {
      operator_delete(local_a0);
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_d8,(long)msg._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    paVar14 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar2 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    iVar4 = 1;
    if (paVar14 == paVar2) goto LAB_001076fa;
    do {
      local_58 = &user.username._M_string_length;
      pcVar3 = (paVar14->username)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar3,pcVar3 + (paVar14->username)._M_string_length);
      psVar11 = local_58;
      user.username.field_2._8_4_ = paVar14->id;
      lVar12 = (long)(int)user.username.field_2._8_4_;
      if ((user.username._M_dataplus._M_p != *(pointer *)(__str.field_2._8_8_ + 8)) ||
         ((user.username._M_dataplus._M_p != (pointer)0x0 &&
          (iVar4 = bcmp(local_58,*(void **)__str.field_2._8_8_,
                        (size_t)user.username._M_dataplus._M_p), iVar4 != 0)))) {
        std::__cxx11::string::_M_assign((string *)(lVar12 * 0x20 + *(long *)username.field_2._8_8_))
        ;
        msgFlags[(int)user.username.field_2._8_4_] = true;
        psVar11 = local_58;
      }
      if (psVar11 != &user.username._M_string_length) {
        operator_delete(psVar11);
      }
      paVar14 = paVar14 + 1;
    } while (paVar14 != paVar2);
  }
  else {
    __it_00._M_current =
         (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
         super__Vector_impl_data._M_start;
    paVar1 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    __str_1.field_2._8_8_ = local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&__str_1.field_2 + 8),local_108,
               username._M_dataplus._M_p + (long)local_108);
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,__str_1.field_2._8_8_,local_128 + __str_1.field_2._8_8_);
    __str._M_string_length = local_68;
    __str._M_dataplus._M_p = local_70;
    local_58 = &user.username._M_string_length;
    local_a0 = local_78;
    psVar11 = &local_68;
    if (local_78 == &local_68) {
      __str.field_2._M_allocated_capacity = sStack_60;
      local_a0 = &__str._M_string_length;
      psVar11 = local_78;
    }
    local_78 = psVar11;
    local_a8 = &__str._M_string_length;
    local_68 = local_68 & 0xffffffffffffff00;
    local_70 = (pointer)0x0;
    msg.field_2._12_4_ = new_fd;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_a0,__str._M_dataplus._M_p + (long)local_a0);
    lVar13 = (long)paVar1 - (long)__it_00._M_current;
    lVar12 = (lVar13 >> 3) * -0x3333333333333333 >> 2;
    local_110 = currUsers;
    if (0 < lVar12) {
      lVar12 = lVar12 + 1;
      do {
        bVar15 = __gnu_cxx::__ops::
                 _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                 ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                               *)&local_58,__it_00);
        __it._M_current = __it_00._M_current;
        if (bVar15) goto LAB_001073b5;
        bVar15 = __gnu_cxx::__ops::
                 _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                 ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                               *)&local_58,__it_00._M_current + 1);
        __it._M_current = __it_00._M_current + 1;
        if (bVar15) goto LAB_001073b5;
        bVar15 = __gnu_cxx::__ops::
                 _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                 ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                               *)&local_58,__it_00._M_current + 2);
        __it._M_current = __it_00._M_current + 2;
        if (bVar15) goto LAB_001073b5;
        bVar15 = __gnu_cxx::__ops::
                 _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                 ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                               *)&local_58,__it_00._M_current + 3);
        __it._M_current = __it_00._M_current + 3;
        if (bVar15) goto LAB_001073b5;
        __it_00._M_current = __it_00._M_current + 4;
        lVar12 = lVar12 + -1;
        lVar13 = lVar13 + -0xa0;
      } while (1 < lVar12);
    }
    lVar12 = (lVar13 >> 3) * -0x3333333333333333;
    if (lVar12 == 1) {
LAB_0010739c:
      bVar15 = __gnu_cxx::__ops::
               _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
               ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                             *)&local_58,__it_00);
      __it._M_current = paVar1;
      if (bVar15) {
        __it._M_current = __it_00._M_current;
      }
    }
    else {
      __it._M_current = __it_00._M_current;
      if (lVar12 == 2) {
LAB_00107370:
        bVar15 = __gnu_cxx::__ops::
                 _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                 ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                               *)&local_58,__it);
        if (!bVar15) {
          __it_00._M_current = __it._M_current + 1;
          goto LAB_0010739c;
        }
      }
      else {
        __it._M_current = paVar1;
        if ((lVar12 == 3) &&
           (bVar15 = __gnu_cxx::__ops::
                     _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                     ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                   *)&local_58,__it_00), __it._M_current = __it_00._M_current,
           !bVar15)) {
          __it._M_current = __it_00._M_current + 1;
          goto LAB_00107370;
        }
      }
    }
LAB_001073b5:
    if (local_58 != &user.username._M_string_length) {
      operator_delete(local_58);
    }
    if (local_a0 != local_a8) {
      operator_delete(local_a0);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if ((undefined1 *)__str_1.field_2._8_8_ != local_120) {
      operator_delete((void *)__str_1.field_2._8_8_);
    }
    if (__it._M_current ==
        (local_110->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      sVar7 = send(msg.field_2._12_4_,"Invalid UserID to send message",0x20,0);
      iVar4 = 0;
      if (sVar7 == -1) {
        perror("Another send error bro");
        iVar4 = 0;
      }
      goto LAB_001076fa;
    }
    local_150 = &__str_1._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,*(long *)__str.field_2._8_8_,
               *(long *)(__str.field_2._8_8_ + 8) + *(long *)__str.field_2._8_8_);
    std::__cxx11::string::append((char *)&local_150);
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_108);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((size_type *)*plVar5 == puVar9) {
      local_68 = *puVar9;
      sStack_60 = plVar5[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *puVar9;
      local_78 = (size_type *)*plVar5;
    }
    local_70 = (pointer)plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
    psVar11 = &__str._M_string_length;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar8) {
      __str._M_string_length = *psVar8;
      __str.field_2._M_allocated_capacity = plVar5[3];
      local_a0 = psVar11;
    }
    else {
      __str._M_string_length = *psVar8;
      local_a0 = (size_type *)*plVar5;
    }
    __str._M_dataplus._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_d8);
    local_58 = &user.username._M_string_length;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar8) {
      user.username._M_string_length = *psVar8;
      user.username.field_2._M_allocated_capacity = plVar5[3];
    }
    else {
      user.username._M_string_length = *psVar8;
      local_58 = (size_type *)*plVar5;
    }
    user.username._M_dataplus._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_58,(long)user.username._M_dataplus._M_p)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (local_58 != &user.username._M_string_length) {
      operator_delete(local_58);
    }
    if (local_a0 != psVar11) {
      operator_delete(local_a0);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if (local_150 != &__str_1._M_string_length) {
      operator_delete(local_150);
    }
    local_a0 = psVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,*(long *)__str.field_2._8_8_,
               *(long *)(__str.field_2._8_8_ + 8) + *(long *)__str.field_2._8_8_);
    std::__cxx11::string::append((char *)&local_a0);
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_d8);
    psVar8 = &user.username._M_string_length;
    psVar10 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar10) {
      user.username._M_string_length = *psVar10;
      user.username.field_2._M_allocated_capacity = plVar5[3];
      local_58 = psVar8;
    }
    else {
      user.username._M_string_length = *psVar10;
      local_58 = (size_type *)*plVar5;
    }
    user.username._M_dataplus._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_58);
    if (local_58 != psVar8) {
      operator_delete(local_58);
    }
    if (local_a0 != psVar11) {
      operator_delete(local_a0);
    }
    std::__cxx11::string::_M_assign
              ((string *)((long)(__it._M_current)->id * 0x20 + *(long *)username.field_2._8_8_));
    msgFlags[(__it._M_current)->id] = true;
  }
  iVar4 = 1;
LAB_001076fa:
  if ((size_type *)local_d8 != &msg._M_string_length) {
    operator_delete(local_d8);
  }
  if ((size_type *)local_108 != &username._M_string_length) {
    operator_delete(local_108);
  }
  return iVar4;
}

Assistant:

int sendMessage(string cmd, int new_fd, const string& currUser, vector<cUser>& currUsers,
 bool* msgFlags, vector<string>& msgs){
    //find where the space is int he
    size_t spacePos = cmd.find(" ");
    //pull out the username to send the message to
    string username = cmd.substr(0,spacePos);
    // pull out th message from the command string
    string msg = cmd.substr(spacePos+1);


    //handle the boadcast case
    if(username == string("all")){
        msg = currUser + ": " + msg;

        cout << msg << endl;

        //set all loged in users message flags and add the message to their queue
        for(cUser user : currUsers){
            if(user.username != currUser){
                msgs[user.id] = msg;
                msgFlags[user.id] = true;
            }
        }
        return 1;
    }

    // check if the message is being sent to a logged in user
    auto it = find_if(currUsers.begin(), currUsers.end(),[username](cUser u){
        return (u.username == username);
    });

    //if the user is logged in set the flag and add the message to their queue
    if(it != currUsers.end()){

        cout << currUser + " (to " + username + "): " + msg << endl;

        msg = currUser + ": " + msg;
        msgs[it->id] = msg;
        msgFlags[it->id] = true;

        return 1;
    }

    //send and error if the user is not logged in
    if(send(new_fd, "Invalid UserID to send message", 32, 0) == -1)
        perror("Another send error bro");

    return 0;
}